

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
::find_soo<int>(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                *this,key_arg<int> *key)

{
  undefined1 auVar1 [16];
  bool bVar2;
  slot_type *psVar3;
  ulong extraout_RDX;
  iterator iVar4;
  
  bVar2 = is_soo(this);
  if (!bVar2) {
    __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe21,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, int>>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashMapPolicy<int, int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, int>>, K = int]"
                 );
  }
  bVar2 = empty(this);
  if (!bVar2) {
    psVar3 = soo_slot(this);
    if ((psVar3->value).first == *key) {
      iVar4 = soo_iterator(this);
      return iVar4;
    }
  }
  AssertNotDebugCapacity(this);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = extraout_RDX;
  return (iterator)(auVar1 << 0x40);
}

Assistant:

iterator find_soo(const key_arg<K>& key) {
    ABSL_SWISSTABLE_ASSERT(is_soo());
    return empty() || !PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                           PolicyTraits::element(soo_slot()))
               ? end()
               : soo_iterator();
  }